

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O0

Index __thiscall
TransitionObservationIndependentMADPDiscrete::SampleSuccessorState
          (TransitionObservationIndependentMADPDiscrete *this,Index sI,Index jaI)

{
  Index IVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  undefined4 in_EDX;
  long *in_RDI;
  Index in_stack_00000024;
  TransitionObservationIndependentMADPDiscrete *in_stack_00000028;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffd8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  TransitionObservationIndependentMADPDiscrete *in_stack_ffffffffffffffe8;
  
  JointToIndividualStateIndices(in_stack_00000028,in_stack_00000024);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            (**(code **)(*in_RDI + 0x60))(in_RDI,in_EDX);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  SampleSuccessorState
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  IVar1 = IndividualToJointStateIndices
                    ((TransitionObservationIndependentMADPDiscrete *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
  return IVar1;
}

Assistant:

Index SampleSuccessorState(Index sI, Index jaI) const
        {
            std::vector<Index> sIs=JointToIndividualStateIndices(sI);
            std::vector<Index> aIs=JointToIndividualActionIndices(jaI);
            return(IndividualToJointStateIndices(SampleSuccessorState(sIs,aIs)));
        }